

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O2

void anon_unknown.dwarf_12b688d::WriteGenexEvaluatorArgument
               (ostream *os,string_view *keyword,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *genexes,string *config,cmLocalGenerator *lg,cmScriptGeneratorIndent indent)

{
  pointer pbVar1;
  ostream *poVar2;
  WrapQuotes wrapQuotes;
  pointer pbVar3;
  bool bVar4;
  string_view str;
  string local_e0;
  string result;
  string local_a0;
  cmLocalGenerator *local_80;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_a0,(string *)config);
  pbVar1 = (genexes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = true;
  local_80 = lg;
  for (pbVar3 = (genexes->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)pbVar3);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    wrapQuotes = Wrap;
    cmGeneratorExpression::Evaluate
              (&result,&local_50,local_80,&local_a0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_50);
    if (result._M_string_length == 0) {
      local_78._M_engaged = false;
    }
    else {
      str._M_str = (char *)0x0;
      str._M_len = (size_t)result._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_e0,(cmOutputConverter *)result._M_string_length,str,wrapQuotes);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    std::__cxx11::string::~string((string *)&result);
    if (local_78._M_engaged == true) {
      if (bVar4) {
        poVar2 = operator<<(os,indent);
        poVar2 = std::operator<<(poVar2,"  ");
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,keyword->_M_str,keyword->_M_len);
        std::operator<<(poVar2,"\n");
      }
      poVar2 = operator<<(os,indent);
      poVar2 = std::operator<<(poVar2,"    ");
      poVar2 = std::operator<<(poVar2,(string *)&local_78);
      std::operator<<(poVar2,"\n");
      bVar4 = false;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_78);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void WriteGenexEvaluatorArgument(std::ostream& os,
                                 const cm::string_view& keyword,
                                 const std::vector<std::string>& genexes,
                                 const std::string& config,
                                 cmLocalGenerator* lg,
                                 cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, genexes, indent,
    [config, lg](const std::string& genex) -> cm::optional<std::string> {
      std::string result = cmGeneratorExpression::Evaluate(genex, lg, config);
      if (result.empty()) {
        return cm::nullopt;
      }
      return cmOutputConverter::EscapeForCMake(result);
    });
}